

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_insi(DisasContext_conflict13 *s,DisasOps *o)

{
  uint64_t uVar1;
  
  uVar1 = s->insn->data;
  tcg_gen_deposit_i64_s390x
            (s->uc->tcg_ctx,o->out,o->in1,o->in2,(uint)uVar1 & 0xff,(uint)(uVar1 >> 8));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_insi(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int shift = s->insn->data & 0xff;
    int size = s->insn->data >> 8;
    tcg_gen_deposit_i64(tcg_ctx, o->out, o->in1, o->in2, shift, size);
    return DISAS_NEXT;
}